

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void * yang_read_ext(lys_module *module,void *actual,char *ext_name,char *ext_arg,
                    yytokentype actual_type,yytokentype backup_type,int is_ext_instance)

{
  int iVar1;
  LY_ERR *pLVar2;
  char *pcVar3;
  LY_STMT local_44;
  lys_ext_instance *plStack_40;
  LY_STMT stmt;
  lys_ext_instance *instance;
  yytokentype backup_type_local;
  yytokentype actual_type_local;
  char *ext_arg_local;
  char *ext_name_local;
  void *actual_local;
  lys_module *module_local;
  
  local_44 = LY_STMT_UNKNOWN;
  if (backup_type == NODE) {
    plStack_40 = yang_ext_instance(actual,actual_type,is_ext_instance);
    if (plStack_40 == (lys_ext_instance *)0x0) {
      return (void *)0x0;
    }
    plStack_40->insubstmt = '\0';
    if (actual_type == ARGUMENT_KEYWORD) {
      plStack_40->insubstmt = '\x01';
      local_44 = LY_STMT_ARGUMENT;
    }
    else if (actual_type == BELONGS_TO_KEYWORD) {
      plStack_40->insubstmt = '\x03';
      local_44 = LY_STMT_BELONGSTO;
    }
    else {
      plStack_40->insubstmt = '\0';
    }
  }
  else {
    plStack_40 = yang_ext_instance(actual,backup_type,is_ext_instance);
    if (plStack_40 == (lys_ext_instance *)0x0) {
      return (void *)0x0;
    }
    switch(actual_type) {
    case BASE_KEYWORD:
      plStack_40->insubstmt = '\x02';
      local_44 = LY_STMT_BASE;
      if (backup_type == IDENTITY_KEYWORD) {
        plStack_40->insubstmt_index = *(uint8_t *)((long)actual + 0x1f);
      }
      else if (backup_type == TYPE_KEYWORD) {
        plStack_40->insubstmt_index =
             (uint8_t)*(undefined4 *)(*(long *)((long)actual + 0x10) + 0x30);
      }
      break;
    default:
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
             ,0x986);
      return (void *)0x0;
    case CONFIG_KEYWORD:
      plStack_40->insubstmt = '\x17';
      local_44 = LY_STMT_CONFIG;
      break;
    case CONTACT_KEYWORD:
      plStack_40->insubstmt = '\x04';
      local_44 = LY_STMT_CONTACT;
      break;
    case DEFAULT_KEYWORD:
      plStack_40->insubstmt = '\x05';
      local_44 = LY_STMT_DEFAULT;
      if (backup_type == LEAF_LIST_KEYWORD) {
        plStack_40->insubstmt_index = *(uint8_t *)((long)actual + 0x1e);
      }
      else if (backup_type == REFINE_KEYWORD) {
        plStack_40->insubstmt_index = *(uint8_t *)((long)actual + 0x1f);
      }
      else if (backup_type == ADD_KEYWORD) {
        plStack_40->insubstmt_index = *(uint8_t *)((long)actual + 5);
      }
      break;
    case DESCRIPTION_KEYWORD:
      plStack_40->insubstmt = '\x06';
      local_44 = LY_STMT_DESCRIPTION;
      break;
    case ERROR_APP_TAG_KEYWORD:
      plStack_40->insubstmt = '\a';
      local_44 = LY_STMT_ERRTAG;
      break;
    case ERROR_MESSAGE_KEYWORD:
      plStack_40->insubstmt = '\b';
      local_44 = LY_STMT_ERRMSG;
      break;
    case FRACTION_DIGITS_KEYWORD:
      plStack_40->insubstmt = '\x1b';
      local_44 = LY_STMT_DIGITS;
      break;
    case KEY_KEYWORD:
      plStack_40->insubstmt = '\t';
      local_44 = LY_STMT_KEY;
      break;
    case MANDATORY_KEYWORD:
      plStack_40->insubstmt = '\x18';
      local_44 = LY_STMT_MANDATORY;
      break;
    case MAX_ELEMENTS_KEYWORD:
      plStack_40->insubstmt = '\x1c';
      local_44 = LY_STMT_MAX;
      break;
    case MIN_ELEMENTS_KEYWORD:
      plStack_40->insubstmt = '\x1d';
      local_44 = LY_STMT_MIN;
      break;
    case NAMESPACE_KEYWORD:
      plStack_40->insubstmt = '\n';
      local_44 = LY_STMT_NAMESPACE;
      break;
    case ORDERED_BY_KEYWORD:
      plStack_40->insubstmt = '\x19';
      local_44 = LY_STMT_ORDEREDBY;
      break;
    case ORGANIZATION_KEYWORD:
      plStack_40->insubstmt = '\v';
      local_44 = LY_STMT_ORGANIZATION;
      break;
    case PATH_KEYWORD:
      plStack_40->insubstmt = '\f';
      local_44 = LY_STMT_PATH;
      break;
    case POSITION_KEYWORD:
      plStack_40->insubstmt = '\x1e';
      local_44 = LY_STMT_POSITION;
      break;
    case PREFIX_KEYWORD:
      plStack_40->insubstmt = '\r';
      local_44 = LY_STMT_PREFIX;
      break;
    case PRESENCE_KEYWORD:
      plStack_40->insubstmt = '\x0e';
      local_44 = LY_STMT_PRESENCE;
      break;
    case REFERENCE_KEYWORD:
      plStack_40->insubstmt = '\x0f';
      local_44 = LY_STMT_REFERENCE;
      break;
    case REQUIRE_INSTANCE_KEYWORD:
      plStack_40->insubstmt = '\x15';
      local_44 = LY_STMT_REQINSTANCE;
      break;
    case REVISION_DATE_KEYWORD:
      plStack_40->insubstmt = '\x10';
      local_44 = LY_STMT_REVISIONDATE;
      break;
    case STATUS_KEYWORD:
      plStack_40->insubstmt = '\x1a';
      local_44 = LY_STMT_STATUS;
      break;
    case UNIQUE_KEYWORD:
      plStack_40->insubstmt = '\x1f';
      local_44 = LY_STMT_UNIQUE;
      if (backup_type == LIST_KEYWORD) {
        plStack_40->insubstmt_index = *(uint8_t *)((long)actual + 0x1f);
      }
      else if (((backup_type == ADD_KEYWORD) || (backup_type == DELETE_KEYWORD)) ||
              (backup_type == REPLACE_KEYWORD)) {
        plStack_40->insubstmt_index = *(uint8_t *)((long)actual + 10);
      }
      break;
    case UNITS_KEYWORD:
      plStack_40->insubstmt = '\x11';
      local_44 = LY_STMT_UNITS;
      break;
    case VALUE_KEYWORD:
      plStack_40->insubstmt = '\x12';
      local_44 = LY_STMT_VALUE;
      break;
    case YANG_VERSION_KEYWORD:
      plStack_40->insubstmt = '\x13';
      local_44 = LY_STMT_VERSION;
      break;
    case YIN_ELEMENT_KEYWORD:
      plStack_40->insubstmt = '\x16';
      local_44 = LY_STMT_YINELEM;
      break;
    case MODIFIER_KEYWORD:
      plStack_40->insubstmt = '\x14';
      local_44 = LY_STMT_MODIFIER;
    }
  }
  plStack_40->flags = plStack_40->flags | 2;
  plStack_40->def = (lys_ext *)ext_name;
  pcVar3 = lydict_insert_zc(module->ctx,ext_arg);
  plStack_40->arg_value = pcVar3;
  if (((is_ext_instance != 0) && (local_44 != LY_STMT_UNKNOWN)) && (plStack_40->parent_type == '\v')
     ) {
    iVar1 = yang_fill_ext_substm_index((lys_ext_instance_complex *)actual,local_44,backup_type);
    plStack_40->insubstmt_index = (uint8_t)iVar1;
  }
  return plStack_40;
}

Assistant:

void *
yang_read_ext(struct lys_module *module, void *actual, char *ext_name, char *ext_arg,
              enum yytokentype actual_type, enum yytokentype backup_type, int is_ext_instance)
{
    struct lys_ext_instance *instance;
    LY_STMT stmt = LY_STMT_UNKNOWN;

    if (backup_type != NODE) {
        instance = yang_ext_instance(actual, backup_type, is_ext_instance);
        if (!instance) {
            return NULL;
        }
        switch (actual_type) {
        case YANG_VERSION_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_VERSION;
            stmt = LY_STMT_VERSION;
            break;
        case NAMESPACE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_NAMESPACE;
            stmt = LY_STMT_NAMESPACE;
            break;
        case PREFIX_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_PREFIX;
            stmt = LY_STMT_PREFIX;
            break;
        case REVISION_DATE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_REVISIONDATE;
            stmt = LY_STMT_REVISIONDATE;
            break;
        case DESCRIPTION_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_DESCRIPTION;
            stmt = LY_STMT_DESCRIPTION;
            break;
        case REFERENCE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_REFERENCE;
            stmt = LY_STMT_REFERENCE;
            break;
        case CONTACT_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_CONTACT;
            stmt = LY_STMT_CONTACT;
            break;
        case ORGANIZATION_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_ORGANIZATION;
            stmt = LY_STMT_ORGANIZATION;
            break;
        case YIN_ELEMENT_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_YINELEM;
            stmt = LY_STMT_YINELEM;
            break;
        case STATUS_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_STATUS;
            stmt = LY_STMT_STATUS;
            break;
        case BASE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_BASE;
            stmt = LY_STMT_BASE;
            if (backup_type == IDENTITY_KEYWORD) {
                instance->insubstmt_index = ((struct lys_ident *)actual)->base_size;
            } else if (backup_type == TYPE_KEYWORD) {
                instance->insubstmt_index = ((struct yang_type *)actual)->type->info.ident.count;
            }
            break;
        case DEFAULT_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_DEFAULT;
            stmt = LY_STMT_DEFAULT;
            switch (backup_type) {
            case LEAF_LIST_KEYWORD:
                instance->insubstmt_index = ((struct lys_node_leaflist *)actual)->dflt_size;
                break;
            case REFINE_KEYWORD:
                instance->insubstmt_index = ((struct lys_refine *)actual)->dflt_size;
                break;
            case ADD_KEYWORD:
                instance->insubstmt_index = ((struct lys_deviate *)actual)->dflt_size;
                break;
            default:
                /* nothing changes */
                break;
            }
            break;
        case UNITS_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_UNITS;
            stmt = LY_STMT_UNITS;
            break;
        case REQUIRE_INSTANCE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_REQINSTANCE;
            stmt = LY_STMT_REQINSTANCE;
            break;
        case PATH_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_PATH;
            stmt = LY_STMT_PATH;
            break;
        case ERROR_MESSAGE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_ERRMSG;
            stmt = LY_STMT_ERRMSG;
            break;
        case ERROR_APP_TAG_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_ERRTAG;
            stmt = LY_STMT_ERRTAG;
            break;
        case MODIFIER_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_MODIFIER;
            stmt = LY_STMT_MODIFIER;
            break;
        case FRACTION_DIGITS_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_DIGITS;
            stmt = LY_STMT_DIGITS;
            break;
        case VALUE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_VALUE;
            stmt = LY_STMT_VALUE;
            break;
        case POSITION_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_POSITION;
            stmt = LY_STMT_POSITION;
            break;
        case PRESENCE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_PRESENCE;
            stmt = LY_STMT_PRESENCE;
            break;
        case CONFIG_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_CONFIG;
            stmt = LY_STMT_CONFIG;
            break;
        case MANDATORY_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_MANDATORY;
            stmt = LY_STMT_MANDATORY;
            break;
        case MIN_ELEMENTS_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_MIN;
            stmt = LY_STMT_MIN;
            break;
        case MAX_ELEMENTS_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_MAX;
            stmt = LY_STMT_MAX;
            break;
        case ORDERED_BY_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_ORDEREDBY;
            stmt = LY_STMT_ORDEREDBY;
            break;
        case KEY_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_KEY;
            stmt = LY_STMT_KEY;
            break;
        case UNIQUE_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_UNIQUE;
            stmt = LY_STMT_UNIQUE;
            switch (backup_type) {
            case LIST_KEYWORD:
                instance->insubstmt_index = ((struct lys_node_list *)actual)->unique_size;
                break;
            case ADD_KEYWORD:
            case DELETE_KEYWORD:
            case REPLACE_KEYWORD:
                instance->insubstmt_index = ((struct lys_deviate *)actual)->unique_size;
                break;
            default:
                /* nothing changes */
                break;
            }
            break;
        default:
            LOGINT;
            return NULL;
        }
    } else {
        instance = yang_ext_instance(actual, actual_type, is_ext_instance);
        if (!instance) {
            return NULL;
        }
        instance->insubstmt = LYEXT_SUBSTMT_SELF;
        switch (actual_type) {
        case ARGUMENT_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_ARGUMENT;
            stmt = LY_STMT_ARGUMENT;
            break;
        case BELONGS_TO_KEYWORD:
            instance->insubstmt = LYEXT_SUBSTMT_BELONGSTO;
            stmt = LY_STMT_BELONGSTO;
            break;
        default:
            instance->insubstmt = LYEXT_SUBSTMT_SELF;
            break;
        }
    }
    instance->flags |= LYEXT_OPT_YANG;
    instance->def = (struct lys_ext *)ext_name;    /* hack for UNRES */
    instance->arg_value = lydict_insert_zc(module->ctx, ext_arg);
    if (is_ext_instance && stmt != LY_STMT_UNKNOWN && instance->parent_type == LYEXT_PAR_EXTINST) {
        instance->insubstmt_index = yang_fill_ext_substm_index(actual, stmt, backup_type);
    }
    return instance;
}